

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.h
# Opt level: O0

string * __thiscall
mvm::disassembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::disassemble_abi_cxx11_
          (string *__return_storage_ptr__,
          disassembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *this)

{
  bool bVar1;
  byte bVar2;
  string *psVar3;
  disassembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this_local;
  string *prog;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = rebasable_ip::assert_in_chunk((rebasable_ip *)this);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  bVar2 = rebasable_ip::operator*((rebasable_ip *)this);
  psVar3 = (string *)(*(code *)(&DAT_001c3178 + *(int *)(&DAT_001c3178 + (ulong)bVar2 * 4)))();
  return psVar3;
}

Assistant:

std::string disassembler<Set, MetaCodeImpl>::disassemble() {
  std::string prog;
  while (m_rebased_ip.assert_in_chunk()) {
    LOG_INFO("disassembler -> process instruction opcode "
             << static_cast<int>(*m_rebased_ip));

#ifdef FASTI
#define MVM_DISASSEMBLER_I(n)                                                  \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      prog.append(this->disassemble_instr<instr_type>() + "\n");               \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;

    switch (*m_rebased_ip) {
      MVM_UNROLL_256(MVM_DISASSEMBLER_I)
    default:
      throw mexcept("[-][mvm] instruction opcode overflow",
                    status_type::INSTR_OPCODE_OVERFLOW);
    }
#else
    instr_set_visitor<instr_set_desc_type>()(
        *m_rebased_ip, [this, &prog](auto &&arg) {
          using instr_type = std::decay_t<decltype(arg)>;
          prog.append(this->disassemble_instr<instr_type>() + "\n");
        });
#endif
    ++m_rebased_ip;
  }

  return prog;
}